

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp_stress.c
# Opt level: O1

void entry(void *args0)

{
  int j;
  uint uVar1;
  int iVar2;
  double tmp_a14106;
  double dVar3;
  double dVar4;
  double dVar5;
  double tmp_a15107_1;
  double dVar6;
  double tmp_a17110_1;
  double dVar7;
  double tmp_a14106_1;
  double dVar8;
  double tmp_a6103_1;
  double dVar9;
  double dVar10;
  double tmp_a15107;
  double dVar11;
  double dVar12;
  double tmp_a10106;
  double dVar13;
  double tmp_a16110;
  double dVar14;
  double tmp_a18111;
  double dVar15;
  double tmp_a7104;
  double dVar16;
  double tmp_a11107;
  double dVar17;
  double dVar18;
  double local_b0;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  
  dVar4 = (double)*(int *)((long)args0 + 0x14);
  dVar15 = A[0] + dVar4;
  local_58 = (double)(*(int *)((long)args0 + 0x14) * 3);
  dVar18 = A[1] + local_58;
  dVar11 = A[2] - dVar4;
  dVar9 = A[3] - local_58;
  dVar16 = A[4] + dVar4;
  dVar7 = A[5] + local_58;
  local_48 = A[6] - dVar4;
  dVar6 = A[7] - local_58;
  dVar12 = A[8] + dVar4;
  dVar13 = A[10] - dVar4;
  local_68 = A[0xc] + dVar4;
  local_50 = A[0xe] - dVar4;
  dVar14 = A[0x10] + dVar4;
  dVar4 = A[0x12] - dVar4;
  local_78 = A[9] + local_58;
  dVar17 = A[0xb] - local_58;
  local_80 = A[0xd] + local_58;
  local_b0 = A[0xf] - local_58;
  local_60 = A[0x11] + local_58;
  local_58 = A[0x13] - local_58;
  if (0 < *(int *)((long)args0 + 0x10)) {
    iVar2 = 0;
    do {
      uVar1 = 0;
      do {
        if ((uVar1 & 1) == 0) {
          dVar3 = local_50 * -31.0 + local_68 * dVar13 + 1.0;
          dVar5 = (dVar13 * dVar3 - (local_50 * local_68 + local_50 * local_68)) + 1.0;
          dVar10 = dVar5 * dVar5 + dVar3 * dVar3;
          dVar12 = dVar3;
          dVar13 = dVar5;
          while (24.0 < dVar10) {
            dVar8 = (dVar13 + dVar12) * 0.058823529411764705;
            dVar13 = (dVar12 - dVar13) * 0.05555555555555555;
            dVar12 = dVar8;
            dVar10 = dVar13 * dVar13 + dVar8 * dVar8;
          }
          local_68 = local_50 * local_50 + dVar3 * 3.0 + -1.0;
          local_50 = ((dVar3 + dVar5) - local_68) + local_50 * -11.0 + -1.0;
          dVar3 = local_50 * local_50 + local_68 * local_68;
          while (27.0 < dVar3) {
            dVar5 = (local_50 + local_68) * 0.058823529411764705;
            local_50 = (local_68 - local_50) * 0.05555555555555555;
            local_68 = dVar5;
            dVar3 = local_50 * local_50 + dVar5 * dVar5;
          }
          dVar3 = local_50 * local_50 + dVar12 * dVar12;
          while (29.0 < dVar3) {
            dVar5 = (local_50 + dVar12) * 0.058823529411764705;
            local_50 = (dVar12 - local_50) * 0.05555555555555555;
            dVar12 = dVar5;
            dVar3 = local_50 * local_50 + dVar5 * dVar5;
          }
          dVar3 = local_68 * local_68 + dVar13 * dVar13;
          while (31.0 < dVar3) {
            dVar5 = (local_68 + dVar13) * 0.058823529411764705;
            local_68 = (dVar13 - local_68) * 0.05555555555555555;
            dVar13 = dVar5;
            dVar3 = local_68 * local_68 + dVar5 * dVar5;
          }
          dVar10 = local_b0 * -31.0 + local_80 * dVar17 + 1.0;
          dVar3 = (dVar17 * dVar10 - (local_b0 * local_80 + local_b0 * local_80)) + 1.0;
          dVar5 = dVar3 * dVar3 + dVar10 * dVar10;
          local_78 = dVar10;
          dVar17 = dVar3;
          while (24.0 < dVar5) {
            dVar8 = (dVar17 + local_78) * 0.058823529411764705;
            dVar17 = (local_78 - dVar17) * 0.05555555555555555;
            local_78 = dVar8;
            dVar5 = dVar17 * dVar17 + dVar8 * dVar8;
          }
          local_80 = local_b0 * local_b0 + dVar10 * 3.0 + -1.0;
          local_b0 = ((dVar10 + dVar3) - local_80) + local_b0 * -11.0 + -1.0;
          dVar3 = local_b0 * local_b0 + local_80 * local_80;
          while (27.0 < dVar3) {
            dVar5 = (local_b0 + local_80) * 0.058823529411764705;
            local_b0 = (local_80 - local_b0) * 0.05555555555555555;
            local_80 = dVar5;
            dVar3 = local_b0 * local_b0 + dVar5 * dVar5;
          }
          dVar3 = local_b0 * local_b0 + local_78 * local_78;
          while (29.0 < dVar3) {
            dVar5 = (local_b0 + local_78) * 0.058823529411764705;
            local_b0 = (local_78 - local_b0) * 0.05555555555555555;
            local_78 = dVar5;
            dVar3 = local_b0 * local_b0 + dVar5 * dVar5;
          }
          dVar3 = local_80 * local_80 + dVar17 * dVar17;
          while (31.0 < dVar3) {
            dVar5 = (local_80 + dVar17) * 0.058823529411764705;
            local_80 = (dVar17 - local_80) * 0.05555555555555555;
            dVar17 = dVar5;
            dVar3 = local_80 * local_80 + dVar5 * dVar5;
          }
        }
        else {
          dVar18 = local_48 * -31.0 + dVar16 * dVar11 + 1.0;
          dVar3 = (dVar11 * dVar18 - (local_48 * dVar16 + local_48 * dVar16)) + 1.0;
          dVar16 = dVar3 * dVar3 + dVar18 * dVar18;
          dVar15 = dVar18;
          dVar11 = dVar3;
          while (24.0 < dVar16) {
            dVar5 = (dVar11 + dVar15) * 0.058823529411764705;
            dVar11 = (dVar15 - dVar11) * 0.05555555555555555;
            dVar15 = dVar5;
            dVar16 = dVar11 * dVar11 + dVar5 * dVar5;
          }
          dVar16 = local_48 * local_48 + dVar18 * 3.0 + -1.0;
          local_48 = ((dVar18 + dVar3) - dVar16) + local_48 * -11.0 + -1.0;
          dVar18 = local_48 * local_48 + dVar16 * dVar16;
          while (27.0 < dVar18) {
            dVar3 = (local_48 + dVar16) * 0.058823529411764705;
            local_48 = (dVar16 - local_48) * 0.05555555555555555;
            dVar16 = dVar3;
            dVar18 = local_48 * local_48 + dVar3 * dVar3;
          }
          dVar18 = local_48 * local_48 + dVar15 * dVar15;
          while (29.0 < dVar18) {
            dVar3 = (local_48 + dVar15) * 0.058823529411764705;
            local_48 = (dVar15 - local_48) * 0.05555555555555555;
            dVar15 = dVar3;
            dVar18 = local_48 * local_48 + dVar3 * dVar3;
          }
          dVar18 = dVar11 * dVar11;
          while (31.0 < dVar16 * dVar16 + dVar18) {
            dVar3 = (dVar16 + dVar11) * 0.058823529411764705;
            dVar18 = dVar3 * dVar3;
            dVar16 = (dVar11 - dVar16) * 0.05555555555555555;
            dVar11 = dVar3;
          }
          dVar5 = dVar6 * -31.0 + dVar7 * dVar9 + 1.0;
          dVar3 = (dVar9 * dVar5 - (dVar6 * dVar7 + dVar6 * dVar7)) + 1.0;
          dVar7 = dVar3 * dVar3 + dVar5 * dVar5;
          dVar18 = dVar5;
          dVar9 = dVar3;
          while (24.0 < dVar7) {
            dVar10 = (dVar9 + dVar18) * 0.058823529411764705;
            dVar9 = (dVar18 - dVar9) * 0.05555555555555555;
            dVar18 = dVar10;
            dVar7 = dVar9 * dVar9 + dVar10 * dVar10;
          }
          dVar7 = dVar6 * dVar6 + dVar5 * 3.0 + -1.0;
          dVar6 = ((dVar5 + dVar3) - dVar7) + dVar6 * -11.0 + -1.0;
          dVar3 = dVar6 * dVar6 + dVar7 * dVar7;
          while (27.0 < dVar3) {
            dVar5 = (dVar6 + dVar7) * 0.058823529411764705;
            dVar6 = (dVar7 - dVar6) * 0.05555555555555555;
            dVar7 = dVar5;
            dVar3 = dVar6 * dVar6 + dVar5 * dVar5;
          }
          dVar3 = dVar6 * dVar6 + dVar18 * dVar18;
          while (29.0 < dVar3) {
            dVar5 = (dVar6 + dVar18) * 0.058823529411764705;
            dVar6 = (dVar18 - dVar6) * 0.05555555555555555;
            dVar18 = dVar5;
            dVar3 = dVar6 * dVar6 + dVar5 * dVar5;
          }
          dVar3 = dVar7 * dVar7 + dVar9 * dVar9;
          while (31.0 < dVar3) {
            dVar5 = (dVar7 + dVar9) * 0.058823529411764705;
            dVar7 = (dVar9 - dVar7) * 0.05555555555555555;
            dVar9 = dVar5;
            dVar3 = dVar7 * dVar7 + dVar5 * dVar5;
          }
        }
        if ((0.0 < dVar11) || (dVar17 < 0.0)) {
          dVar3 = local_60 * -31.0 + dVar14 * dVar9 + 1.0;
          dVar5 = (dVar14 * dVar3 - (dVar9 * local_60 + dVar9 * local_60)) + 1.0;
          dVar9 = dVar5 * dVar5 + dVar3 * dVar3;
          dVar15 = dVar3;
          dVar14 = dVar5;
          while (24.0 < dVar9) {
            dVar10 = (dVar14 + dVar15) * 0.058823529411764705;
            dVar14 = (dVar15 - dVar14) * 0.05555555555555555;
            dVar15 = dVar10;
            dVar9 = dVar14 * dVar14 + dVar10 * dVar10;
          }
          dVar9 = local_60 * local_60 + dVar3 * 3.0 + -1.0;
          local_60 = ((dVar3 + dVar5) - dVar9) + local_60 * -11.0 + -1.0;
          dVar3 = local_60 * local_60 + dVar9 * dVar9;
          while (27.0 < dVar3) {
            dVar5 = (local_60 + dVar9) * 0.058823529411764705;
            local_60 = (dVar9 - local_60) * 0.05555555555555555;
            dVar9 = dVar5;
            dVar3 = local_60 * local_60 + dVar5 * dVar5;
          }
          dVar3 = local_60 * local_60 + dVar15 * dVar15;
          while (29.0 < dVar3) {
            dVar5 = (local_60 + dVar15) * 0.058823529411764705;
            local_60 = (dVar15 - local_60) * 0.05555555555555555;
            dVar15 = dVar5;
            dVar3 = local_60 * local_60 + dVar5 * dVar5;
          }
          dVar3 = dVar9 * dVar9 + dVar14 * dVar14;
          while (31.0 < dVar3) {
            dVar5 = (dVar14 + dVar9) * 0.058823529411764705;
            dVar9 = (dVar14 - dVar9) * 0.05555555555555555;
            dVar14 = dVar5;
            dVar3 = dVar9 * dVar9 + dVar5 * dVar5;
          }
          dVar3 = local_58 * -31.0 + dVar4 * local_b0 + 1.0;
          dVar5 = (dVar4 * dVar3 - (local_b0 * local_58 + local_b0 * local_58)) + 1.0;
          dVar10 = dVar5 * dVar5 + dVar3 * dVar3;
          local_68 = dVar3;
          dVar4 = dVar5;
          while (24.0 < dVar10) {
            dVar8 = (dVar4 + local_68) * 0.058823529411764705;
            dVar4 = (local_68 - dVar4) * 0.05555555555555555;
            local_68 = dVar8;
            dVar10 = dVar4 * dVar4 + dVar8 * dVar8;
          }
          local_b0 = local_58 * local_58 + dVar3 * 3.0 + -1.0;
          local_58 = ((dVar3 + dVar5) - local_b0) + local_58 * -11.0 + -1.0;
          dVar3 = local_58 * local_58 + local_b0 * local_b0;
          while (27.0 < dVar3) {
            dVar5 = (local_58 + local_b0) * 0.058823529411764705;
            local_58 = (local_b0 - local_58) * 0.05555555555555555;
            local_b0 = dVar5;
            dVar3 = local_58 * local_58 + dVar5 * dVar5;
          }
          dVar3 = local_58 * local_58 + local_68 * local_68;
          while (29.0 < dVar3) {
            dVar5 = (local_58 + local_68) * 0.058823529411764705;
            local_58 = (local_68 - local_58) * 0.05555555555555555;
            local_68 = dVar5;
            dVar3 = local_58 * local_58 + dVar5 * dVar5;
          }
          dVar3 = local_b0 * local_b0 + dVar4 * dVar4;
          while (31.0 < dVar3) {
            dVar5 = (dVar4 + local_b0) * 0.058823529411764705;
            local_b0 = (dVar4 - local_b0) * 0.05555555555555555;
            dVar4 = dVar5;
            dVar3 = local_b0 * local_b0 + dVar5 * dVar5;
          }
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != 0x10);
      fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
      if (((uint)(iVar2 * -0x3d70a3d7) >> 1 | (uint)((iVar2 * -0x3d70a3d7 & 1U) != 0) << 0x1f) <
          0x51eb852) {
        A[6] = local_48;
        A[9] = local_78;
        A[0xc] = local_68;
        A[0xd] = local_80;
        A[0xe] = local_50;
        A[0xf] = local_b0;
        A[0x11] = local_60;
        A[0x13] = local_58;
        A[0] = dVar15;
        A[1] = dVar18;
        A[2] = dVar11;
        A[3] = dVar9;
        A[4] = dVar16;
        A[5] = dVar7;
        A[7] = dVar6;
        A[8] = dVar12;
        A[10] = dVar13;
        A[0xb] = dVar17;
        A[0x10] = dVar14;
        A[0x12] = dVar4;
        print(*(int *)((long)args0 + 0x14));
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < *(int *)((long)args0 + 0x10));
  }
  A[6] = local_48;
  A[0xc] = local_68;
  A[0xd] = local_80;
  A[0xe] = local_50;
  A[0xf] = local_b0;
  A[0x11] = local_60;
  A[0x13] = local_58;
  A[0] = dVar15;
  A[1] = dVar18;
  A[2] = dVar11;
  A[3] = dVar9;
  A[4] = dVar16;
  A[5] = dVar7;
  A[7] = dVar6;
  A[8] = dVar12;
  A[9] = local_78;
  A[10] = dVar13;
  A[0xb] = dVar17;
  A[0x10] = dVar14;
  A[0x12] = dVar4;
  print(*(int *)((long)args0 + 0x14));
  *(undefined1 *)((long)args0 + 0x18) = 1;
  fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
  return;
}

Assistant:

static void
entry(void *args0)
{
    Args *args = (Args *) args0;
    DEF_A(0, 1, 2, 3);
    DEF_A(4, 5, 6, 7);
    DEF_A(8, 9, 10, 11);
    DEF_A(12, 13, 14, 15);
    DEF_A(16, 17, 18, 19);

    for (int i = 0; i < args->n; ++i) {
        for (int j = 0; j < 16; ++j) {
            if (j & 1) {
                MIX(0, 2, 4, 6);
                MIX(1, 3, 5, 7);
            } else {
                MIX(8, 10, 12, 14);
                MIX(9, 11, 13, 15);
            }
            if (a2 > 0 || a11 < 0) {
                MIX(0, 16, 3, 17);
                MIX(12, 18, 15, 19);
            }
        }
        fiber_switch(args->self, args->caller);
        if (i % 50 == 0) {
            STORE_ALL;
            print(args->id);
        }
    }

    STORE_ALL;
    print(args->id);
    args->done = true;
    fiber_switch(args->self, args->caller);
}